

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::FindAdjacentContours(iterator current,ContourVector *contours)

{
  bool bVar1;
  bool bVar2;
  reference pPVar3;
  reference pPVar4;
  SkipList *this;
  reference pPVar5;
  double dVar6;
  reference pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  float fVar10;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  const_iterator __position;
  const_iterator __position_00;
  double local_240;
  byte local_219;
  bool local_201;
  _Bit_type *local_200;
  uint local_1f8;
  _Bit_type *local_1f0;
  uint local_1e8;
  iterator local_1e0;
  _Bit_iterator local_1d0;
  undefined1 local_1c0 [12];
  aiVector2t<double> *local_1b0;
  __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_1a8;
  __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_1a0;
  const_iterator local_198;
  aiVector2t<double> local_190;
  reference local_180;
  _Bit_type *local_170;
  uint local_168;
  bool local_159;
  _Bit_type *local_158;
  uint local_150;
  _Bit_type *local_148;
  uint local_140;
  iterator local_138;
  _Bit_iterator local_128;
  undefined1 local_118 [12];
  aiVector2t<double> *local_108;
  __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_100;
  __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_f8;
  const_iterator local_f0;
  aiVector2t<double> local_e8;
  undefined1 local_d8 [8];
  IfcVector2 isect1;
  IfcVector2 isect0;
  IfcVector2 m1;
  IfcVector2 m0;
  size_t mend;
  size_t m;
  IfcVector2 n1;
  IfcVector2 n0;
  size_t n;
  Contour *mcontour;
  Contour *ncontour;
  BoundingBox *ibb;
  const_iterator cStack_40;
  bool is_me;
  const_iterator end;
  const_iterator it;
  SkipList *skiplist;
  BoundingBox *bb;
  IfcFloat sqlen_epsilon;
  ContourVector *contours_local;
  iterator current_local;
  
  contours_local = (ContourVector *)current._M_current;
  fVar10 = Math::getEpsilon<float>();
  pPVar3 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&contours_local);
  pPVar4 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&contours_local);
  this = &pPVar4->skiplist;
  end = std::
        vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ::begin(contours);
  cStack_40 = std::
              vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
              ::end(contours);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffc0);
    if (!bVar1) {
      return;
    }
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
             ::operator*(&end);
    bVar1 = ProjectedWindowContour::IsInvalid(pPVar5);
    if (!bVar1) {
      bVar1 = __gnu_cxx::operator==
                        (&end,(__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                               *)&contours_local);
      pPVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
               ::operator*(&end);
      local_219 = 1;
      if (!bVar1) {
        bVar2 = BoundingBoxesOverlapping(&pPVar3->bb,&pPVar5->bb);
        local_219 = bVar2 ^ 0xff;
      }
      if ((local_219 & 1) == 0) {
        __assert_fail("is_me || !BoundingBoxesOverlapping(bb, ibb)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                      ,0x2c6,
                      "void Assimp::IFC::FindAdjacentContours(ContourVector::iterator, const ContourVector &)"
                     );
      }
      if ((bVar1) || (bVar2 = BoundingBoxesAdjacent(&pPVar3->bb,&pPVar5->bb), bVar2)) {
        pPVar4 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                              *)&contours_local);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        for (n0.y = 0.0;
            dVar6 = (double)std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                            size(&pPVar4->contour), (ulong)n0.y < (ulong)dVar6;
            n0.y = (double)((long)n0.y + 1)) {
          pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::operator[]
                             (&pPVar4->contour,(size_type)n0.y);
          n1.y = pvVar7->x;
          sVar8 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                            (&pPVar4->contour);
          pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::operator[]
                             (&pPVar4->contour,((long)n0.y + 1U) % sVar8);
          m = (size_t)pvVar7->x;
          n1.x = pvVar7->y;
          mend = 0;
          if (bVar1) {
            local_240 = n0.y;
          }
          else {
            local_240 = (double)std::
                                vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                                size(&pPVar5->contour);
          }
          for (; mend < (ulong)local_240; mend = mend + 1) {
            if (pPVar5 == pPVar4 && (ulong)n0.y <= mend) {
              __assert_fail("&mcontour != &ncontour || m < n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                            ,0x2d7,
                            "void Assimp::IFC::FindAdjacentContours(ContourVector::iterator, const ContourVector &)"
                           );
            }
            pvVar9 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                     operator[](&pPVar5->contour,mend);
            m1.y = pvVar9->x;
            sVar8 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                              (&pPVar5->contour);
            pvVar9 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                     operator[](&pPVar5->contour,(mend + 1) % sVar8);
            isect0.y = pvVar9->x;
            m1.x = pvVar9->y;
            aiVector2t<double>::aiVector2t((aiVector2t<double> *)&isect1.y);
            aiVector2t<double>::aiVector2t((aiVector2t<double> *)local_d8);
            bVar2 = IntersectingLineSegments
                              ((IfcVector2 *)&n1.y,(IfcVector2 *)&m,(IfcVector2 *)&m1.y,
                               (IfcVector2 *)&isect0.y,(IfcVector2 *)&isect1.y,
                               (IfcVector2 *)local_d8);
            if (bVar2) {
              local_e8 = ::operator-((aiVector2t<double> *)&isect1.y,(aiVector2t<double> *)&n1.y);
              dVar6 = aiVector2t<double>::SquareLength(&local_e8);
              if (dVar6 <= (double)fVar10) {
                local_180 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                      (this,(size_type)n0.y);
                std::_Bit_reference::operator=(&local_180,true);
              }
              else {
                n0.y = (double)((long)n0.y + 1);
                local_100._M_current =
                     (aiVector2t<double> *)
                     std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                               (&pPVar4->contour);
                local_f8 = __gnu_cxx::
                           __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                           ::operator+(&local_100,(difference_type)n0.y);
                __gnu_cxx::
                __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                ::__normal_iterator<aiVector2t<double>*>
                          ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                            *)&local_f0,&local_f8);
                local_108 = (aiVector2t<double> *)
                            std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                            insert(&pPVar4->contour,local_f0,(value_type *)&isect1.y);
                iVar11 = std::vector<bool,_std::allocator<bool>_>::begin(this);
                local_148 = iVar11.super__Bit_iterator_base._M_p;
                local_140 = iVar11.super__Bit_iterator_base._M_offset;
                local_138.super__Bit_iterator_base._M_p = local_148;
                local_138.super__Bit_iterator_base._M_offset = local_140;
                iVar12 = std::operator+(&local_138,(difference_type)n0.y);
                local_158 = iVar12.super__Bit_iterator_base._M_p;
                local_150 = iVar12.super__Bit_iterator_base._M_offset;
                local_128.super__Bit_iterator_base._M_p = local_158;
                local_128.super__Bit_iterator_base._M_offset = local_150;
                std::_Bit_const_iterator::_Bit_const_iterator
                          ((_Bit_const_iterator *)local_118,&local_128);
                local_159 = true;
                __position.super__Bit_iterator_base._12_4_ = 0;
                __position.super__Bit_iterator_base._M_p = (_Bit_type *)local_118._0_8_;
                __position.super__Bit_iterator_base._M_offset = local_118._8_4_;
                iVar13 = std::vector<bool,_std::allocator<bool>_>::insert
                                   (this,__position,&local_159);
                local_170 = iVar13.super__Bit_iterator_base._M_p;
                local_168 = iVar13.super__Bit_iterator_base._M_offset;
              }
              local_190 = ::operator-((aiVector2t<double> *)local_d8,(aiVector2t<double> *)&m);
              dVar6 = aiVector2t<double>::SquareLength(&local_190);
              if ((double)fVar10 < dVar6) {
                n0.y = (double)((long)n0.y + 1);
                local_1a8._M_current =
                     (aiVector2t<double> *)
                     std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                               (&pPVar4->contour);
                local_1a0 = __gnu_cxx::
                            __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                            ::operator+(&local_1a8,(difference_type)n0.y);
                __gnu_cxx::
                __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                ::__normal_iterator<aiVector2t<double>*>
                          ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                            *)&local_198,&local_1a0);
                local_1b0 = (aiVector2t<double> *)
                            std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                            insert(&pPVar4->contour,local_198,(value_type *)local_d8);
                iVar11 = std::vector<bool,_std::allocator<bool>_>::begin(this);
                local_1f0 = iVar11.super__Bit_iterator_base._M_p;
                local_1e8 = iVar11.super__Bit_iterator_base._M_offset;
                local_1e0.super__Bit_iterator_base._M_p = local_1f0;
                local_1e0.super__Bit_iterator_base._M_offset = local_1e8;
                iVar12 = std::operator+(&local_1e0,(difference_type)n0.y);
                local_200 = iVar12.super__Bit_iterator_base._M_p;
                local_1f8 = iVar12.super__Bit_iterator_base._M_offset;
                local_1d0.super__Bit_iterator_base._M_p = local_200;
                local_1d0.super__Bit_iterator_base._M_offset = local_1f8;
                std::_Bit_const_iterator::_Bit_const_iterator
                          ((_Bit_const_iterator *)local_1c0,&local_1d0);
                local_201 = false;
                __position_00.super__Bit_iterator_base._12_4_ = 0;
                __position_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_1c0._0_8_;
                __position_00.super__Bit_iterator_base._M_offset = local_1c0._8_4_;
                std::vector<bool,_std::allocator<bool>_>::insert(this,__position_00,&local_201);
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

void FindAdjacentContours(ContourVector::iterator current, const ContourVector& contours)
{
    const IfcFloat sqlen_epsilon = static_cast<IfcFloat>(Math::getEpsilon<float>());
    const BoundingBox& bb = (*current).bb;

    // What is to be done here is to populate the skip lists for the contour
    // and to add necessary padding points when needed.
    SkipList& skiplist = (*current).skiplist;

    // First step to find possible adjacent contours is to check for adjacent bounding
    // boxes. If the bounding boxes are not adjacent, the contours lines cannot possibly be.
    for (ContourVector::const_iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }

        // this left here to make clear we also run on the current contour
        // to check for overlapping contour segments (which can happen due
        // to projection artifacts).
        //if(it == current) {
        //  continue;
        //}

        const bool is_me = it == current;

        const BoundingBox& ibb = (*it).bb;

        // Assumption: the bounding boxes are pairwise disjoint or identical
        ai_assert(is_me || !BoundingBoxesOverlapping(bb, ibb));

        if (is_me || BoundingBoxesAdjacent(bb, ibb)) {

            // Now do a each-against-everyone check for intersecting contour
            // lines. This obviously scales terribly, but in typical real
            // world Ifc files it will not matter since most windows that
            // are adjacent to each others are rectangular anyway.

            Contour& ncontour = (*current).contour;
            const Contour& mcontour = (*it).contour;

            for (size_t n = 0; n < ncontour.size(); ++n) {
                const IfcVector2 n0 = ncontour[n];
                const IfcVector2 n1 = ncontour[(n+1) % ncontour.size()];

                for (size_t m = 0, mend = (is_me ? n : mcontour.size()); m < mend; ++m) {
                    ai_assert(&mcontour != &ncontour || m < n);

                    const IfcVector2 m0 = mcontour[m];
                    const IfcVector2 m1 = mcontour[(m+1) % mcontour.size()];

                    IfcVector2 isect0, isect1;
                    if (IntersectingLineSegments(n0,n1, m0, m1, isect0, isect1)) {

                        if ((isect0 - n0).SquareLength() > sqlen_epsilon) {
                            ++n;

                            ncontour.insert(ncontour.begin() + n, isect0);
                            skiplist.insert(skiplist.begin() + n, true);
                        }
                        else {
                            skiplist[n] = true;
                        }

                        if ((isect1 - n1).SquareLength() > sqlen_epsilon) {
                            ++n;

                            ncontour.insert(ncontour.begin() + n, isect1);
                            skiplist.insert(skiplist.begin() + n, false);
                        }
                    }
                }
            }
        }
    }
}